

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MethodBuilder.cpp
# Opt level: O0

uint8_t * __thiscall
Lodtalk::MethodAssembler::PushClosure::encode(PushClosure *this,uint8_t *buffer)

{
  int iVar1;
  uint8_t *puVar2;
  uint8_t *buffer_local;
  PushClosure *this_local;
  
  iVar1 = extendAValue(this);
  puVar2 = InstructionNode::encodeExtA(&this->super_InstructionNode,buffer,(long)iVar1);
  iVar1 = extendBValue(this);
  puVar2 = InstructionNode::encodeExtB(&this->super_InstructionNode,puVar2,(long)iVar1);
  *puVar2 = 0xfa;
  puVar2[1] = (byte)((this->numExtensions & 3U) << 6) | (byte)this->numArgs & 7 |
              (byte)((this->numCopied & 3U) << 7);
  iVar1 = blockSize(this);
  puVar2[2] = (uint8_t)iVar1;
  return puVar2 + 3;
}

Assistant:

virtual uint8_t *encode(uint8_t *buffer)
    	{
            buffer = encodeExtA(buffer, extendAValue());
            buffer = encodeExtB(buffer, extendBValue());

    		*buffer++ = BytecodeSet::PushClosure;
    		*buffer++ =
                ((numExtensions & BytecodeSet::PushClosure_NumExtensionsMask) << BytecodeSet::PushClosure_NumExtensionsShift) |
                ((numArgs & BytecodeSet::PushClosure_NumArgsMask) << BytecodeSet::PushClosure_NumArgsShift) |
                ((numCopied & BytecodeSet::PushClosure_NumCopiedMask) << BytecodeSet::PushClosure_NumCopiedShift);
            *buffer++ = blockSize() & 0xFF;
    		return buffer;
    	}